

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ContinueStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::ContinueStatement,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  SourceRange sourceRange;
  ContinueStatement *pCVar1;
  SourceLocation in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pCVar1 = (ContinueStatement *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = *(SourceLocation *)((long)in_RSI + 8);
  ast::ContinueStatement::ContinueStatement(*(ContinueStatement **)in_RSI,sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }